

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

int Llb_ManFlowVerifyCut(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  Aig_ManIncrementTravId(p);
  for (iVar3 = 0; iVar3 < vMinCut->nSize; iVar3 = iVar3 + 1) {
    pvVar2 = Vec_PtrEntry(vMinCut,iVar3);
    *(int *)((long)pvVar2 + 0x20) = p->nTravIds;
  }
  iVar3 = 0;
  do {
    if (p->nRegs <= iVar3) {
      return 1;
    }
    pvVar2 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar3);
    iVar1 = Llb_ManFlowVerifyCut_rec
                      (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe));
    iVar3 = iVar3 + 1;
  } while (iVar1 != 0);
  return 0;
}

Assistant:

int Llb_ManFlowVerifyCut( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pObj;
    int i;
    // mark the cut with the current traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // search from the latches for a path to the COs/CIs
    Saig_ManForEachLi( p, pObj, i )
    {
        if ( !Llb_ManFlowVerifyCut_rec( p, Aig_ObjFanin0(pObj) ) )
            return 0;
    }
    return 1;
}